

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<float>::SwapElements
          (RepeatedFieldWrapper<float> *this,Field *data,int index1,int index2)

{
  float fVar1;
  RepeatedField<float> *this_00;
  float *pfVar2;
  
  this_00 = (RepeatedField<float> *)(**(code **)(*(long *)this + 0x88))();
  pfVar2 = RepeatedField<float>::elements
                     (this_00,(undefined1  [16])
                              ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4
                              ) == (undefined1  [16])0x0);
  fVar1 = pfVar2[index1];
  pfVar2[index1] = pfVar2[index2];
  pfVar2[index2] = fVar1;
  return;
}

Assistant:

void SwapElements(Field* data, int index1, int index2) const override {
    MutableRepeatedField(data)->SwapElements(index1, index2);
  }